

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O0

OrderType duckdb::GetOrder<duckdb::OrderType>(ClientContext *context,Expression *expr)

{
  OrderType OVar1;
  ulong uVar2;
  InvalidInputException *this;
  char *pcVar3;
  long *in_RSI;
  Expression *in_RDI;
  string order_name;
  Value order_value;
  string local_c8 [32];
  string local_a8 [32];
  ClientContext local_88 [67];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  long *local_10;
  Expression *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = (**(code **)(*in_RSI + 0x78))();
  if ((uVar2 & 1) == 0) {
    local_45 = 1;
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Sorting order must be a constant",&local_31);
    duckdb::InvalidInputException::InvalidInputException(this,local_30);
    local_45 = 0;
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  duckdb::ExpressionExecutor::EvaluateScalar(local_88,local_8,SUB81(local_10,0));
  duckdb::Value::ToString_abi_cxx11_();
  duckdb::StringUtil::Upper(local_a8);
  std::__cxx11::string::~string(local_c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  OVar1 = duckdb::EnumUtil::FromString<duckdb::OrderType>(pcVar3);
  std::__cxx11::string::~string(local_a8);
  duckdb::Value::~Value((Value *)local_88);
  return OVar1;
}

Assistant:

static T GetOrder(ClientContext &context, Expression &expr) {
	if (!expr.IsFoldable()) {
		throw InvalidInputException("Sorting order must be a constant");
	}
	Value order_value = ExpressionExecutor::EvaluateScalar(context, expr);
	auto order_name = StringUtil::Upper(order_value.ToString());
	return EnumUtil::FromString<T>(order_name.c_str());
}